

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_combine_interintra
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane,uint8_t *inter_pred,int inter_stride,
               uint8_t *intra_pred,int intra_stride)

{
  BLOCK_SIZE plane_bsize;
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  MB_MODE_INFO *pMVar4;
  uint8_t *puVar5;
  int iVar6;
  uint32_t uVar7;
  undefined7 in_register_00000031;
  int iVar8;
  ulong uVar9;
  uint8_t local_4038 [16392];
  
  uVar9 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  plane_bsize = av1_ss_size_lookup[uVar9][xd->plane[plane].subsampling_x]
                [xd->plane[plane].subsampling_y];
  pMVar4 = *xd->mi;
  puVar5 = xd->plane[plane].dst.buf;
  uVar2 = xd->plane[plane].dst.stride;
  iVar8 = (int)CONCAT71(in_register_00000031,bsize);
  if ((xd->cur_buf->flags & 8) == 0) {
    uVar7 = (uint32_t)block_size_wide[plane_bsize];
    iVar3 = (int)block_size_high[plane_bsize];
    if ((*(ushort *)&pMVar4->field_0xa7 >> 10 & 1) == 0) {
      (*aom_blend_a64_mask)
                (puVar5,uVar2,intra_pred,intra_stride,inter_pred,inter_stride,
                 smooth_interintra_mask_buf[pMVar4->interintra_mode][plane_bsize],uVar7,uVar7,iVar3,
                 0,0);
    }
    else if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar8 << 5))
            ) {
      (*aom_blend_a64_mask)
                (puVar5,uVar2,intra_pred,intra_stride,inter_pred,inter_stride,
                 *(uint8_t **)
                  (*(long *)((long)&av1_wedge_params_lookup[0].masks + (ulong)(uint)(iVar8 << 5)) +
                  (long)pMVar4->interintra_wedge_index * 8),(uint32_t)block_size_wide[uVar9],uVar7,
                 iVar3,SUB14((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                   [uVar9] * 2 == (uint)block_size_wide[plane_bsize],0),
                 SUB14((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [uVar9] * 2 == (uint)block_size_high[plane_bsize],0));
    }
  }
  else {
    iVar3 = xd->bd;
    bVar1 = block_size_wide[plane_bsize];
    uVar7 = (uint32_t)bVar1;
    iVar6 = (int)block_size_high[plane_bsize];
    if ((*(ushort *)&pMVar4->field_0xa7 >> 10 & 1) == 0) {
      build_smooth_interintra_mask(local_4038,(uint)bVar1,plane_bsize,pMVar4->interintra_mode);
      (*aom_highbd_blend_a64_mask)
                (puVar5,uVar2,intra_pred,intra_stride,inter_pred,inter_stride,local_4038,uVar7,uVar7
                 ,iVar6,0,0,iVar3);
    }
    else if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar8 << 5))
            ) {
      (*aom_highbd_blend_a64_mask)
                (puVar5,uVar2,intra_pred,intra_stride,inter_pred,inter_stride,
                 *(uint8_t **)
                  (*(long *)((long)&av1_wedge_params_lookup[0].masks + (ulong)(uint)(iVar8 << 5)) +
                  (long)pMVar4->interintra_wedge_index * 8),(uint32_t)block_size_wide[uVar9],uVar7,
                 iVar6,SUB14((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                   [uVar9] * 2 == (uint)bVar1,0),
                 SUB14((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [uVar9] * 2 == (uint)block_size_high[plane_bsize],0),iVar3);
    }
  }
  return;
}

Assistant:

void av1_combine_interintra(MACROBLOCKD *xd, BLOCK_SIZE bsize, int plane,
                            const uint8_t *inter_pred, int inter_stride,
                            const uint8_t *intra_pred, int intra_stride) {
  const int ssx = xd->plane[plane].subsampling_x;
  const int ssy = xd->plane[plane].subsampling_y;
  const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ssx, ssy);
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    combine_interintra_highbd(
        xd->mi[0]->interintra_mode, xd->mi[0]->use_wedge_interintra,
        xd->mi[0]->interintra_wedge_index, INTERINTRA_WEDGE_SIGN, bsize,
        plane_bsize, xd->plane[plane].dst.buf, xd->plane[plane].dst.stride,
        inter_pred, inter_stride, intra_pred, intra_stride, xd->bd);
    return;
  }
#endif
  combine_interintra(
      xd->mi[0]->interintra_mode, xd->mi[0]->use_wedge_interintra,
      xd->mi[0]->interintra_wedge_index, INTERINTRA_WEDGE_SIGN, bsize,
      plane_bsize, xd->plane[plane].dst.buf, xd->plane[plane].dst.stride,
      inter_pred, inter_stride, intra_pred, intra_stride);
}